

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

void __thiscall
icu_63::RBBITableBuilder::calcChainedFollowPos(RBBITableBuilder *this,RBBINode *tree)

{
  UVector *this_00;
  UBool UVar1;
  int32_t iVar2;
  UChar32 c_00;
  void *pvVar3;
  void *pvVar4;
  int *piVar5;
  RBBINode *startNode;
  ULineBreak cLBProp;
  UChar32 c;
  RBBINode *endNode;
  RBBINode *tNode;
  int32_t startNodeIx;
  int32_t endNodeIx;
  RBBINode *node;
  undefined1 local_d0 [4];
  int j;
  UVector matchStartNodes;
  UVector ruleRootNodes;
  int32_t local_78;
  int32_t i;
  undefined1 local_68 [8];
  UVector leafNodes;
  UVector endMarkerNodes;
  RBBINode *tree_local;
  RBBITableBuilder *this_local;
  
  UVector::UVector((UVector *)&leafNodes.comparer,this->fStatus);
  UVector::UVector((UVector *)local_68,this->fStatus);
  UVar1 = ::U_FAILURE(*this->fStatus);
  if (UVar1 == '\0') {
    RBBINode::findNodes(tree,(UVector *)&leafNodes.comparer,endMark,this->fStatus);
    RBBINode::findNodes(tree,(UVector *)local_68,leafChar,this->fStatus);
    UVar1 = ::U_FAILURE(*this->fStatus);
    if (UVar1 == '\0') {
      UVector::UVector((UVector *)&matchStartNodes.comparer,this->fStatus);
      addRuleRootNodes(this,(UVector *)&matchStartNodes.comparer,tree);
      UVector::UVector((UVector *)local_d0,this->fStatus);
      for (node._4_4_ = 0; iVar2 = UVector::size((UVector *)&matchStartNodes.comparer),
          node._4_4_ < iVar2; node._4_4_ = node._4_4_ + 1) {
        pvVar3 = UVector::elementAt((UVector *)&matchStartNodes.comparer,node._4_4_);
        if (*(char *)((long)pvVar3 + 0x82) != '\0') {
          setAdd(this,(UVector *)local_d0,*(UVector **)((long)pvVar3 + 0x88));
        }
      }
      UVar1 = ::U_FAILURE(*this->fStatus);
      if (UVar1 == '\0') {
        for (tNode._4_4_ = 0; iVar2 = UVector::size((UVector *)local_68), tNode._4_4_ < iVar2;
            tNode._4_4_ = tNode._4_4_ + 1) {
          pvVar3 = UVector::elementAt((UVector *)local_68,tNode._4_4_);
          _cLBProp = (void *)0x0;
          for (local_78 = 0; iVar2 = UVector::size((UVector *)&leafNodes.comparer),
              pvVar4 = _cLBProp, local_78 < iVar2; local_78 = local_78 + 1) {
            this_00 = *(UVector **)((long)pvVar3 + 0x98);
            pvVar4 = UVector::elementAt((UVector *)&leafNodes.comparer,local_78);
            UVar1 = UVector::contains(this_00,pvVar4);
            pvVar4 = pvVar3;
            if (UVar1 != '\0') break;
          }
          _cLBProp = pvVar4;
          if ((_cLBProp != (void *)0x0) &&
             (((this->fRB->fLBCMNoChain == '\0' ||
               (c_00 = RBBISetBuilder::getFirstChar
                                 (this->fRB->fSetBuilder,*(int32_t *)((long)_cLBProp + 0x7c)),
               c_00 == -1)) || (iVar2 = u_getIntPropertyValue_63(c_00,UCHAR_LINE_BREAK), iVar2 != 9)
              ))) {
            for (tNode._0_4_ = 0; iVar2 = UVector::size((UVector *)local_d0), (int)tNode < iVar2;
                tNode._0_4_ = (int)tNode + 1) {
              piVar5 = (int *)UVector::elementAt((UVector *)local_d0,(int)tNode);
              if ((*piVar5 == 3) && (*(int *)((long)_cLBProp + 0x7c) == piVar5[0x1f])) {
                setAdd(this,*(UVector **)((long)_cLBProp + 0x98),*(UVector **)(piVar5 + 0x26));
              }
            }
          }
        }
      }
      UVector::~UVector((UVector *)local_d0);
      UVector::~UVector((UVector *)&matchStartNodes.comparer);
    }
  }
  UVector::~UVector((UVector *)local_68);
  UVector::~UVector((UVector *)&leafNodes.comparer);
  return;
}

Assistant:

void RBBITableBuilder::calcChainedFollowPos(RBBINode *tree) {

    UVector         endMarkerNodes(*fStatus);
    UVector         leafNodes(*fStatus);
    int32_t         i;

    if (U_FAILURE(*fStatus)) {
        return;
    }

    // get a list of all endmarker nodes.
    tree->findNodes(&endMarkerNodes, RBBINode::endMark, *fStatus);

    // get a list all leaf nodes
    tree->findNodes(&leafNodes, RBBINode::leafChar, *fStatus);
    if (U_FAILURE(*fStatus)) {
        return;
    }

    // Collect all leaf nodes that can start matches for rules
    // with inbound chaining enabled, which is the union of the 
    // firstPosition sets from each of the rule root nodes.
    
    UVector ruleRootNodes(*fStatus);
    addRuleRootNodes(&ruleRootNodes, tree);

    UVector matchStartNodes(*fStatus);
    for (int j=0; j<ruleRootNodes.size(); ++j) {
        RBBINode *node = static_cast<RBBINode *>(ruleRootNodes.elementAt(j));
        if (node->fChainIn) {
            setAdd(&matchStartNodes, node->fFirstPosSet);
        }
    }
    if (U_FAILURE(*fStatus)) {
        return;
    }

    int32_t  endNodeIx;
    int32_t  startNodeIx;

    for (endNodeIx=0; endNodeIx<leafNodes.size(); endNodeIx++) {
        RBBINode *tNode   = (RBBINode *)leafNodes.elementAt(endNodeIx);
        RBBINode *endNode = NULL;

        // Identify leaf nodes that correspond to overall rule match positions.
        //   These include an endMarkerNode in their followPos sets.
        for (i=0; i<endMarkerNodes.size(); i++) {
            if (tNode->fFollowPos->contains(endMarkerNodes.elementAt(i))) {
                endNode = tNode;
                break;
            }
        }
        if (endNode == NULL) {
            // node wasn't an end node.  Try again with the next.
            continue;
        }

        // We've got a node that can end a match.

        // Line Break Specific hack:  If this node's val correspond to the $CM char class,
        //                            don't chain from it.
        // TODO:  Add rule syntax for this behavior, get specifics out of here and
        //        into the rule file.
        if (fRB->fLBCMNoChain) {
            UChar32 c = this->fRB->fSetBuilder->getFirstChar(endNode->fVal);
            if (c != -1) {
                // c == -1 occurs with sets containing only the {eof} marker string.
                ULineBreak cLBProp = (ULineBreak)u_getIntPropertyValue(c, UCHAR_LINE_BREAK);
                if (cLBProp == U_LB_COMBINING_MARK) {
                    continue;
                }
            }
        }


        // Now iterate over the nodes that can start a match, looking for ones
        //   with the same char class as our ending node.
        RBBINode *startNode;
        for (startNodeIx = 0; startNodeIx<matchStartNodes.size(); startNodeIx++) {
            startNode = (RBBINode *)matchStartNodes.elementAt(startNodeIx);
            if (startNode->fType != RBBINode::leafChar) {
                continue;
            }

            if (endNode->fVal == startNode->fVal) {
                // The end val (character class) of one possible match is the
                //   same as the start of another.

                // Add all nodes from the followPos of the start node to the
                //  followPos set of the end node, which will have the effect of
                //  letting matches transition from a match state at endNode
                //  to the second char of a match starting with startNode.
                setAdd(endNode->fFollowPos, startNode->fFollowPos);
            }
        }
    }
}